

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  float *vertices_2;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong unaff_R12;
  size_t mask;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  size_t sVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  byte bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  int local_1464;
  long local_1460;
  long local_1458;
  long local_1450;
  long local_1448;
  long local_1440;
  long local_1438;
  ulong local_1430;
  NodeRef *local_1428;
  Scene *scene;
  ulong local_1418;
  ulong local_1410;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  byte local_1347;
  float local_1338 [4];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  uVar17 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar17 != 8) {
    fVar68 = ray->tfar;
    vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar55 = vucomiss_avx512f(ZEXT416((uint)fVar68));
    auVar75 = ZEXT1664(auVar55);
    if (uVar17 < 9) {
      local_1428 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar3 = (ray->dir).field_0.field_1;
      auVar41 = vmaxss_avx512f(auVar55,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar42._8_4_ = 0x7fffffff;
      auVar42._0_8_ = 0x7fffffff7fffffff;
      auVar42._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx512vl((undefined1  [16])aVar3,auVar42);
      auVar60._8_4_ = 0x219392ef;
      auVar60._0_8_ = 0x219392ef219392ef;
      auVar60._12_4_ = 0x219392ef;
      uVar17 = vcmpps_avx512vl(auVar42,auVar60,1);
      bVar39 = (bool)((byte)uVar17 & 1);
      auVar56._0_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * (int)aVar3.x;
      bVar39 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar56._4_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * (int)aVar3.y;
      bVar39 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar56._8_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * (int)aVar3.z;
      bVar39 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar56._12_4_ = (uint)bVar39 * 0x219392ef | (uint)!bVar39 * aVar3.field_3.a;
      auVar42 = vrcp14ps_avx512vl(auVar56);
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = &DAT_3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar43 = vfnmadd213ps_avx512vl(auVar56,auVar42,auVar43);
      vfmadd132ps_fma(auVar43,auVar42,auVar42);
      auVar43 = vucomiss_avx512f(auVar55);
      auVar61 = vbroadcastss_avx512vl(auVar43);
      auVar76 = ZEXT3264(auVar61);
      auVar42 = vmovshdup_avx(auVar43);
      auVar61 = vbroadcastsd_avx512vl(auVar42);
      auVar77 = ZEXT3264(auVar61);
      auVar62._8_4_ = 2;
      auVar62._0_8_ = 0x200000002;
      auVar62._12_4_ = 2;
      auVar62._16_4_ = 2;
      auVar62._20_4_ = 2;
      auVar62._24_4_ = 2;
      auVar62._28_4_ = 2;
      vshufpd_avx(auVar43,auVar43,1);
      auVar61 = vpermps_avx512vl(auVar62,ZEXT1632(auVar43));
      auVar78 = ZEXT3264(auVar61);
      fVar67 = auVar43._0_4_ * (ray->org).field_0.m128[0];
      auVar61._8_4_ = 1;
      auVar61._0_8_ = 0x100000001;
      auVar61._12_4_ = 1;
      auVar61._16_4_ = 1;
      auVar61._20_4_ = 1;
      auVar61._24_4_ = 1;
      auVar61._28_4_ = 1;
      auVar63 = ZEXT1632(CONCAT412(auVar43._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar43._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar43._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar67))));
      auVar61 = vpermps_avx2(auVar61,auVar63);
      auVar63 = vpermps_avx2(auVar62,auVar63);
      lVar37 = 0;
      vucomiss_avx512f(auVar55);
      lVar24 = 0x40;
      vucomiss_avx512f(auVar55);
      lVar26 = 0x80;
      lVar28 = 0x20;
      lVar30 = 0x60;
      lVar20 = 0xa0;
      auVar62 = vbroadcastss_avx512vl(auVar41);
      auVar79 = ZEXT3264(auVar62);
      local_1278._4_4_ = fVar68;
      local_1278._0_4_ = fVar68;
      local_1278._8_4_ = fVar68;
      local_1278._12_4_ = fVar68;
      local_1278._16_4_ = fVar68;
      local_1278._20_4_ = fVar68;
      local_1278._24_4_ = fVar68;
      local_1278._28_4_ = fVar68;
      auVar71 = ZEXT3264(local_1278);
      local_1298._0_8_ = CONCAT44(fVar67,fVar67) ^ 0x8000000080000000;
      local_1298._8_4_ = -fVar67;
      local_1298._12_4_ = -fVar67;
      local_1298._16_4_ = -fVar67;
      local_1298._20_4_ = -fVar67;
      local_1298._24_4_ = -fVar67;
      local_1298._28_4_ = -fVar67;
      auVar73 = ZEXT3264(local_1298);
      local_12b8._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
      local_12b8._8_4_ = auVar61._8_4_ ^ 0x80000000;
      local_12b8._12_4_ = auVar61._12_4_ ^ 0x80000000;
      local_12b8._16_4_ = auVar61._16_4_ ^ 0x80000000;
      local_12b8._20_4_ = auVar61._20_4_ ^ 0x80000000;
      local_12b8._24_4_ = auVar61._24_4_ ^ 0x80000000;
      local_12b8._28_4_ = auVar61._28_4_ ^ 0x80000000;
      auVar72 = ZEXT3264(local_12b8);
      local_12d8._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
      local_12d8._8_4_ = auVar63._8_4_ ^ 0x80000000;
      local_12d8._12_4_ = auVar63._12_4_ ^ 0x80000000;
      local_12d8._16_4_ = auVar63._16_4_ ^ 0x80000000;
      local_12d8._20_4_ = auVar63._20_4_ ^ 0x80000000;
      local_12d8._24_4_ = auVar63._24_4_ ^ 0x80000000;
      local_12d8._28_4_ = auVar63._28_4_ ^ 0x80000000;
      auVar74 = ZEXT3264(local_12d8);
      local_1438 = 0;
      local_1440 = 0x40;
      local_1448 = 0x80;
      local_1450 = 0x20;
      local_1458 = 0x60;
      local_1460 = 0xa0;
      do {
        if (local_1428 == stack) {
          return;
        }
        sVar36 = local_1428[-1].ptr;
        local_1428 = local_1428 + -1;
        local_1430 = unaff_R12;
        do {
          if ((sVar36 & 8) == 0) {
            uVar17 = sVar36 & 0xfffffffffffffff0;
            uVar2 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar66._4_4_ = uVar2;
            auVar66._0_4_ = uVar2;
            auVar66._8_4_ = uVar2;
            auVar66._12_4_ = uVar2;
            auVar66._16_4_ = uVar2;
            auVar66._20_4_ = uVar2;
            auVar66._24_4_ = uVar2;
            auVar66._28_4_ = uVar2;
            auVar55 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + lVar37),auVar66,
                                      *(undefined1 (*) [32])(uVar17 + 0x40 + lVar37));
            auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar55),auVar76._0_32_,auVar73._0_32_);
            auVar63 = vmaxps_avx512vl(auVar79._0_32_,auVar61);
            auVar55 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + lVar24),auVar66,
                                      *(undefined1 (*) [32])(uVar17 + 0x40 + lVar24));
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + lVar26),auVar66,
                                      *(undefined1 (*) [32])(uVar17 + 0x40 + lVar26));
            auVar61 = vfmadd213ps_avx512vl(ZEXT1632(auVar55),auVar77._0_32_,auVar72._0_32_);
            auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar78._0_32_,auVar74._0_32_);
            auVar61 = vmaxps_avx(auVar61,auVar62);
            auVar61 = vmaxps_avx(auVar63,auVar61);
            auVar55 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + lVar28),auVar66,
                                      *(undefined1 (*) [32])(uVar17 + 0x40 + lVar28));
            auVar63 = vfmadd213ps_avx512vl(ZEXT1632(auVar55),auVar76._0_32_,auVar73._0_32_);
            auVar63 = vminps_avx(auVar71._0_32_,auVar63);
            auVar55 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + lVar30),auVar66,
                                      *(undefined1 (*) [32])(uVar17 + 0x40 + lVar30));
            auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar17 + 0x100 + lVar20),auVar66,
                                      *(undefined1 (*) [32])(uVar17 + 0x40 + lVar20));
            auVar62 = vfmadd213ps_avx512vl(ZEXT1632(auVar55),auVar77._0_32_,auVar72._0_32_);
            auVar64 = vfmadd213ps_avx512vl(ZEXT1632(auVar42),auVar78._0_32_,auVar74._0_32_);
            auVar62 = vminps_avx(auVar62,auVar64);
            auVar63 = vminps_avx(auVar63,auVar62);
            if (((uint)sVar36 & 7) == 6) {
              uVar15 = vcmpps_avx512vl(auVar61,auVar63,2);
              uVar12 = vcmpps_avx512vl(auVar66,*(undefined1 (*) [32])(uVar17 + 0x1c0),0xd);
              uVar13 = vcmpps_avx512vl(auVar66,*(undefined1 (*) [32])(uVar17 + 0x1e0),1);
              bVar40 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13;
            }
            else {
              uVar15 = vcmpps_avx512vl(auVar61,auVar63,2);
              bVar40 = (byte)uVar15;
            }
            local_1430 = CONCAT44((int)(local_1430 >> 0x20),(uint)bVar40);
          }
          if ((sVar36 & 8) == 0) {
            if (local_1430 == 0) {
              iVar21 = 4;
            }
            else {
              uVar35 = sVar36 & 0xfffffffffffffff0;
              lVar18 = 0;
              for (uVar17 = local_1430; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000
                  ) {
                lVar18 = lVar18 + 1;
              }
              iVar21 = 0;
              for (uVar17 = local_1430 - 1 & local_1430; sVar36 = *(size_t *)(uVar35 + lVar18 * 8),
                  uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
                local_1428->ptr = sVar36;
                local_1428 = local_1428 + 1;
                lVar18 = 0;
                for (uVar34 = uVar17; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000)
                {
                  lVar18 = lVar18 + 1;
                }
              }
            }
          }
          else {
            iVar21 = 6;
          }
        } while (iVar21 == 0);
        if (iVar21 == 6) {
          iVar21 = 0;
          local_1418 = (ulong)((uint)sVar36 & 0xf) - 8;
          bVar39 = local_1418 != 0;
          if (bVar39) {
            uVar35 = sVar36 & 0xfffffffffffffff0;
            scene = context->scene;
            uVar17 = 0;
            do {
              local_1410 = uVar17;
              lVar24 = uVar17 * 0x50;
              pGVar8 = (scene->geometries).items[*(uint *)(uVar35 + 0x30 + lVar24)].ptr;
              fVar68 = (pGVar8->time_range).lower;
              fVar68 = pGVar8->fnumTimeSegments *
                       (((ray->dir).field_0.m128[3] - fVar68) /
                       ((pGVar8->time_range).upper - fVar68));
              auVar55 = vroundss_avx(ZEXT416((uint)fVar68),ZEXT416((uint)fVar68),9);
              auVar55 = vminss_avx(auVar55,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
              auVar44 = vmaxss_avx512f(auVar75._0_16_,auVar55);
              lVar37 = (long)(int)auVar44._0_4_ * 0x38;
              lVar20 = *(long *)(*(long *)&pGVar8[2].numPrimitives + lVar37);
              auVar55 = *(undefined1 (*) [16])(lVar20 + (ulong)*(uint *)(uVar35 + lVar24) * 4);
              uVar34 = (ulong)*(uint *)(uVar35 + 0x10 + lVar24);
              auVar42 = *(undefined1 (*) [16])(lVar20 + uVar34 * 4);
              uVar19 = (ulong)*(uint *)(uVar35 + 0x20 + lVar24);
              auVar43 = *(undefined1 (*) [16])(lVar20 + uVar19 * 4);
              uVar23 = (ulong)*(uint *)(uVar35 + 4 + lVar24);
              auVar41 = *(undefined1 (*) [16])(lVar20 + uVar23 * 4);
              uVar25 = (ulong)*(uint *)(uVar35 + 0x14 + lVar24);
              auVar56 = *(undefined1 (*) [16])(lVar20 + uVar25 * 4);
              uVar27 = (ulong)*(uint *)(uVar35 + 0x24 + lVar24);
              auVar60 = *(undefined1 (*) [16])(lVar20 + uVar27 * 4);
              uVar29 = (ulong)*(uint *)(uVar35 + 8 + lVar24);
              auVar45 = *(undefined1 (*) [16])(lVar20 + uVar29 * 4);
              uVar31 = (ulong)*(uint *)(uVar35 + 0x18 + lVar24);
              auVar47 = *(undefined1 (*) [16])(lVar20 + uVar31 * 4);
              uVar32 = (ulong)*(uint *)(uVar35 + 0x28 + lVar24);
              auVar58 = *(undefined1 (*) [16])(lVar20 + uVar32 * 4);
              uVar22 = (ulong)*(uint *)(uVar35 + 0xc + lVar24);
              auVar59 = *(undefined1 (*) [16])(lVar20 + uVar22 * 4);
              uVar33 = (ulong)*(uint *)(uVar35 + 0x1c + lVar24);
              auVar57 = *(undefined1 (*) [16])(lVar20 + uVar33 * 4);
              lVar37 = *(long *)(*(long *)&pGVar8[2].numPrimitives + 0x38 + lVar37);
              uVar38 = (ulong)*(uint *)(uVar35 + 0x2c + lVar24);
              auVar46 = *(undefined1 (*) [16])(lVar20 + uVar38 * 4);
              auVar48 = *(undefined1 (*) [16])(lVar37 + (ulong)*(uint *)(uVar35 + lVar24) * 4);
              auVar49 = *(undefined1 (*) [16])(lVar37 + uVar34 * 4);
              auVar52 = *(undefined1 (*) [16])(lVar37 + uVar19 * 4);
              auVar50 = *(undefined1 (*) [16])(lVar37 + uVar23 * 4);
              auVar51 = *(undefined1 (*) [16])(lVar37 + uVar25 * 4);
              auVar53 = *(undefined1 (*) [16])(lVar37 + uVar27 * 4);
              auVar54 = *(undefined1 (*) [16])(lVar37 + uVar29 * 4);
              auVar65 = *(undefined1 (*) [16])(lVar37 + uVar31 * 4);
              auVar4 = *(undefined1 (*) [16])(lVar37 + uVar32 * 4);
              auVar5 = *(undefined1 (*) [16])(lVar37 + uVar22 * 4);
              auVar6 = *(undefined1 (*) [16])(lVar37 + uVar33 * 4);
              auVar7 = *(undefined1 (*) [16])(lVar37 + uVar38 * 4);
              puVar1 = (undefined8 *)(uVar35 + 0x30 + lVar24);
              local_1398 = *puVar1;
              uStack_1390 = puVar1[1];
              puVar1 = (undefined8 *)(uVar35 + 0x40 + lVar24);
              auVar10 = vunpcklps_avx(auVar55,auVar45);
              auVar55 = vunpckhps_avx(auVar55,auVar45);
              auVar45 = vunpcklps_avx(auVar41,auVar59);
              auVar41 = vunpckhps_avx(auVar41,auVar59);
              auVar59 = vunpcklps_avx(auVar55,auVar41);
              auVar11 = vunpcklps_avx(auVar10,auVar45);
              auVar55 = vunpckhps_avx(auVar10,auVar45);
              auVar45 = vunpcklps_avx(auVar42,auVar47);
              auVar42 = vunpckhps_avx(auVar42,auVar47);
              auVar47 = vunpcklps_avx(auVar56,auVar57);
              auVar41 = vunpckhps_avx(auVar56,auVar57);
              auVar56 = vunpcklps_avx(auVar42,auVar41);
              auVar57 = vunpcklps_avx(auVar45,auVar47);
              auVar42 = vunpckhps_avx(auVar45,auVar47);
              auVar45 = vunpcklps_avx(auVar43,auVar58);
              auVar43 = vunpckhps_avx(auVar43,auVar58);
              auVar47 = vunpcklps_avx(auVar60,auVar46);
              auVar41 = vunpckhps_avx(auVar60,auVar46);
              auVar60 = vunpcklps_avx(auVar43,auVar41);
              auVar58 = vunpcklps_avx(auVar45,auVar47);
              auVar43 = vunpckhps_avx(auVar45,auVar47);
              auVar41 = vunpcklps_avx512vl(auVar48,auVar54);
              auVar45 = vunpckhps_avx512vl(auVar48,auVar54);
              auVar46 = vunpcklps_avx512vl(auVar50,auVar5);
              auVar47 = vunpckhps_avx512vl(auVar50,auVar5);
              auVar45 = vunpcklps_avx(auVar45,auVar47);
              auVar47 = vunpcklps_avx(auVar41,auVar46);
              auVar41 = vunpckhps_avx(auVar41,auVar46);
              auVar46 = vunpcklps_avx512vl(auVar49,auVar65);
              auVar48 = vunpckhps_avx512vl(auVar49,auVar65);
              auVar49 = vunpcklps_avx512vl(auVar51,auVar6);
              auVar50 = vunpckhps_avx512vl(auVar51,auVar6);
              auVar48 = vunpcklps_avx512vl(auVar48,auVar50);
              auVar50 = vunpcklps_avx512vl(auVar46,auVar49);
              auVar49 = vunpckhps_avx512vl(auVar46,auVar49);
              auVar51 = vunpcklps_avx512vl(auVar52,auVar4);
              auVar46 = vunpckhps_avx512vl(auVar52,auVar4);
              auVar52 = vunpcklps_avx512vl(auVar53,auVar7);
              auVar53 = vunpckhps_avx512vl(auVar53,auVar7);
              auVar46 = vunpcklps_avx(auVar46,auVar53);
              auVar53 = vunpcklps_avx512vl(auVar51,auVar52);
              auVar52 = vunpckhps_avx512vl(auVar51,auVar52);
              auVar54 = ZEXT416((uint)(fVar68 - auVar44._0_4_));
              auVar51 = vbroadcastss_avx512vl(auVar54);
              auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar54);
              auVar65._0_4_ = auVar54._0_4_;
              auVar65._4_4_ = auVar65._0_4_;
              auVar65._8_4_ = auVar65._0_4_;
              auVar65._12_4_ = auVar65._0_4_;
              auVar47 = vmulps_avx512vl(auVar51,auVar47);
              auVar41 = vmulps_avx512vl(auVar51,auVar41);
              auVar54 = vmulps_avx512vl(auVar51,auVar45);
              auVar45 = vfmadd231ps_fma(auVar47,auVar65,auVar11);
              auVar47 = vfmadd231ps_fma(auVar41,auVar65,auVar55);
              auVar59 = vfmadd231ps_fma(auVar54,auVar65,auVar59);
              auVar55 = vmulps_avx512vl(auVar51,auVar50);
              auVar41 = vmulps_avx512vl(auVar51,auVar49);
              auVar48 = vmulps_avx512vl(auVar51,auVar48);
              auVar55 = vfmadd231ps_fma(auVar55,auVar65,auVar57);
              auVar42 = vfmadd231ps_fma(auVar41,auVar65,auVar42);
              auVar41 = vfmadd231ps_fma(auVar48,auVar65,auVar56);
              auVar56 = vmulps_avx512vl(auVar51,auVar53);
              auVar57 = vmulps_avx512vl(auVar51,auVar52);
              auVar46 = vmulps_avx512vl(auVar51,auVar46);
              auVar56 = vfmadd231ps_fma(auVar56,auVar65,auVar58);
              auVar58 = vfmadd231ps_fma(auVar57,auVar65,auVar43);
              auVar60 = vfmadd231ps_fma(auVar46,auVar65,auVar60);
              local_13a8 = *puVar1;
              uStack_13a0 = puVar1[1];
              auVar55 = vsubps_avx(auVar45,auVar55);
              auVar42 = vsubps_avx(auVar47,auVar42);
              auVar43 = vsubps_avx(auVar59,auVar41);
              auVar41 = vsubps_avx(auVar56,auVar45);
              auVar56 = vsubps_avx(auVar58,auVar47);
              auVar60 = vsubps_avx(auVar60,auVar59);
              auVar57._0_4_ = auVar42._0_4_ * auVar60._0_4_;
              auVar57._4_4_ = auVar42._4_4_ * auVar60._4_4_;
              auVar57._8_4_ = auVar42._8_4_ * auVar60._8_4_;
              auVar57._12_4_ = auVar42._12_4_ * auVar60._12_4_;
              local_1308 = vfmsub231ps_fma(auVar57,auVar56,auVar43);
              auVar46._0_4_ = auVar43._0_4_ * auVar41._0_4_;
              auVar46._4_4_ = auVar43._4_4_ * auVar41._4_4_;
              auVar46._8_4_ = auVar43._8_4_ * auVar41._8_4_;
              auVar46._12_4_ = auVar43._12_4_ * auVar41._12_4_;
              local_12f8 = vfmsub231ps_fma(auVar46,auVar60,auVar55);
              auVar48._0_4_ = auVar55._0_4_ * auVar56._0_4_;
              auVar48._4_4_ = auVar55._4_4_ * auVar56._4_4_;
              auVar48._8_4_ = auVar55._8_4_ * auVar56._8_4_;
              auVar48._12_4_ = auVar55._12_4_ * auVar56._12_4_;
              fVar68 = (ray->dir).field_0.m128[0];
              auVar50._4_4_ = fVar68;
              auVar50._0_4_ = fVar68;
              auVar50._8_4_ = fVar68;
              auVar50._12_4_ = fVar68;
              auVar57 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[1]));
              auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
              uVar2 = *(undefined4 *)&(ray->org).field_0;
              auVar58._4_4_ = uVar2;
              auVar58._0_4_ = uVar2;
              auVar58._8_4_ = uVar2;
              auVar58._12_4_ = uVar2;
              auVar58 = vsubps_avx512vl(auVar45,auVar58);
              local_12e8 = vfmsub231ps_fma(auVar48,auVar41,auVar42);
              uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar45._4_4_ = uVar2;
              auVar45._0_4_ = uVar2;
              auVar45._8_4_ = uVar2;
              auVar45._12_4_ = uVar2;
              auVar48 = vsubps_avx512vl(auVar47,auVar45);
              uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar47._4_4_ = uVar2;
              auVar47._0_4_ = uVar2;
              auVar47._8_4_ = uVar2;
              auVar47._12_4_ = uVar2;
              auVar47 = vsubps_avx512vl(auVar59,auVar47);
              auVar45 = vmulps_avx512vl(auVar57,auVar47);
              auVar49 = vfmsub231ps_avx512vl(auVar45,auVar48,auVar46);
              auVar45 = vmulps_avx512vl(auVar46,auVar58);
              auVar45 = vfmsub231ps_fma(auVar45,auVar47,auVar50);
              auVar52._0_4_ = fVar68 * auVar48._0_4_;
              auVar52._4_4_ = fVar68 * auVar48._4_4_;
              auVar52._8_4_ = fVar68 * auVar48._8_4_;
              auVar52._12_4_ = fVar68 * auVar48._12_4_;
              auVar52 = vfmsub231ps_avx512vl(auVar52,auVar58,auVar57);
              auVar59 = vmulps_avx512vl(local_12e8,auVar46);
              auVar59 = vfmadd231ps_avx512vl(auVar59,local_12f8,auVar57);
              auVar57 = vfmadd231ps_avx512vl(auVar59,local_1308,auVar50);
              auVar59._8_4_ = 0x7fffffff;
              auVar59._0_8_ = 0x7fffffff7fffffff;
              auVar59._12_4_ = 0x7fffffff;
              local_1358 = vandps_avx512vl(auVar57,auVar59);
              auVar60 = vmulps_avx512vl(auVar60,auVar52);
              auVar56 = vfmadd231ps_avx512vl(auVar60,auVar45,auVar56);
              auVar56 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar41);
              auVar41._8_4_ = 0x80000000;
              auVar41._0_8_ = 0x8000000080000000;
              auVar41._12_4_ = 0x80000000;
              auVar41 = vandpd_avx512vl(auVar57,auVar41);
              local_1388 = vxorps_avx512vl(auVar41,auVar56);
              auVar51._0_4_ = auVar43._0_4_ * auVar52._0_4_;
              auVar51._4_4_ = auVar43._4_4_ * auVar52._4_4_;
              auVar51._8_4_ = auVar43._8_4_ * auVar52._8_4_;
              auVar51._12_4_ = auVar43._12_4_ * auVar52._12_4_;
              auVar42 = vfmadd231ps_fma(auVar51,auVar42,auVar45);
              auVar55 = vfmadd231ps_fma(auVar42,auVar55,auVar49);
              local_1378._0_4_ = (float)(auVar41._0_4_ ^ auVar55._0_4_);
              local_1378._4_4_ = (float)(auVar41._4_4_ ^ auVar55._4_4_);
              local_1378._8_4_ = (float)(auVar41._8_4_ ^ auVar55._8_4_);
              local_1378._12_4_ = (float)(auVar41._12_4_ ^ auVar55._12_4_);
              auVar55 = ZEXT816(0) << 0x20;
              uVar15 = vcmpps_avx512vl(local_1388,auVar55,5);
              uVar12 = vcmpps_avx512vl(local_1378,auVar55,5);
              uVar13 = vcmpps_avx512vl(auVar57,auVar55,4);
              auVar55._0_4_ = local_1378._0_4_ + local_1388._0_4_;
              auVar55._4_4_ = local_1378._4_4_ + local_1388._4_4_;
              auVar55._8_4_ = local_1378._8_4_ + local_1388._8_4_;
              auVar55._12_4_ = local_1378._12_4_ + local_1388._12_4_;
              uVar14 = vcmpps_avx512vl(auVar55,local_1358,2);
              local_1347 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
              if (local_1347 != 0) {
                auVar54._0_4_ = local_12e8._0_4_ * auVar47._0_4_;
                auVar54._4_4_ = local_12e8._4_4_ * auVar47._4_4_;
                auVar54._8_4_ = local_12e8._8_4_ * auVar47._8_4_;
                auVar54._12_4_ = local_12e8._12_4_ * auVar47._12_4_;
                auVar55 = vfmadd213ps_fma(auVar48,local_12f8,auVar54);
                auVar55 = vfmadd213ps_fma(auVar58,local_1308,auVar55);
                local_1368._0_4_ = (float)(auVar41._0_4_ ^ auVar55._0_4_);
                local_1368._4_4_ = (float)(auVar41._4_4_ ^ auVar55._4_4_);
                local_1368._8_4_ = (float)(auVar41._8_4_ ^ auVar55._8_4_);
                local_1368._12_4_ = (float)(auVar41._12_4_ ^ auVar55._12_4_);
                uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar49._4_4_ = uVar2;
                auVar49._0_4_ = uVar2;
                auVar49._8_4_ = uVar2;
                auVar49._12_4_ = uVar2;
                auVar55 = vmulps_avx512vl(local_1358,auVar49);
                fVar68 = ray->tfar;
                auVar53._4_4_ = fVar68;
                auVar53._0_4_ = fVar68;
                auVar53._8_4_ = fVar68;
                auVar53._12_4_ = fVar68;
                auVar42 = vmulps_avx512vl(local_1358,auVar53);
                uVar15 = vcmpps_avx512vl(local_1368,auVar42,2);
                uVar12 = vcmpps_avx512vl(auVar55,local_1368,1);
                local_1347 = (byte)uVar15 & (byte)uVar12 & local_1347;
                if (local_1347 != 0) {
                  auVar55 = vrcp14ps_avx512vl(local_1358);
                  auVar4._8_4_ = 0x3f800000;
                  auVar4._0_8_ = &DAT_3f8000003f800000;
                  auVar4._12_4_ = 0x3f800000;
                  auVar42 = vfnmadd213ps_avx512vl(local_1358,auVar55,auVar4);
                  auVar55 = vfmadd132ps_fma(auVar42,auVar55,auVar55);
                  fVar68 = auVar55._0_4_;
                  fVar67 = auVar55._4_4_;
                  fVar69 = auVar55._8_4_;
                  fVar70 = auVar55._12_4_;
                  local_1318[0] = fVar68 * local_1368._0_4_;
                  local_1318[1] = fVar67 * local_1368._4_4_;
                  local_1318[2] = fVar69 * local_1368._8_4_;
                  local_1318[3] = fVar70 * local_1368._12_4_;
                  local_1338[0] = fVar68 * local_1388._0_4_;
                  local_1338[1] = fVar67 * local_1388._4_4_;
                  local_1338[2] = fVar69 * local_1388._8_4_;
                  local_1338[3] = fVar70 * local_1388._12_4_;
                  local_1328._0_4_ = fVar68 * local_1378._0_4_;
                  local_1328._4_4_ = fVar67 * local_1378._4_4_;
                  local_1328._8_4_ = fVar69 * local_1378._8_4_;
                  local_1328._12_4_ = fVar70 * local_1378._12_4_;
                  uVar34 = (ulong)local_1347;
                  do {
                    auVar55 = auVar75._0_16_;
                    uVar22 = 0;
                    for (uVar19 = uVar34; (uVar19 & 1) == 0;
                        uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                      uVar22 = uVar22 + 1;
                    }
                    h.geomID = *(uint *)((long)&local_1398 + uVar22 * 4);
                    pGVar8 = (scene->geometries).items[h.geomID].ptr;
                    if ((pGVar8->mask & ray->mask) == 0) {
                      uVar34 = uVar34 ^ 1L << (uVar22 & 0x3f);
                      bVar16 = true;
                    }
                    else {
                      pRVar9 = context->args;
                      if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar16 = false;
                      }
                      else {
                        local_1258 = auVar79._0_32_;
                        local_1238 = auVar78._0_32_;
                        local_1218 = auVar77._0_32_;
                        local_11f8 = auVar76._0_32_;
                        uVar19 = (ulong)(uint)((int)uVar22 * 4);
                        args.context = context->user;
                        h.Ng.field_0.field_0.x = *(float *)(local_1308 + uVar19);
                        h.Ng.field_0.field_0.y = *(float *)(local_12f8 + uVar19);
                        h.Ng.field_0.field_0.z = *(float *)(local_12e8 + uVar19);
                        h.u = *(float *)((long)local_1338 + uVar19);
                        h.v = *(float *)(local_1328 + uVar19);
                        h.primID = *(uint *)((long)&local_13a8 + uVar19);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar68 = ray->tfar;
                        ray->tfar = *(float *)((long)local_1318 + uVar19);
                        local_1464 = -1;
                        args.valid = &local_1464;
                        args.geometryUserPtr = pGVar8->userPtr;
                        args.ray = (RTCRayN *)ray;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        if ((pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar8->occlusionFilterN)(&args), *args.valid != 0)) {
                          if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar9->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_00725371;
                          }
                          bVar16 = false;
                        }
                        else {
LAB_00725371:
                          ray->tfar = fVar68;
                          uVar34 = uVar34 ^ 1L << (uVar22 & 0x3f);
                          bVar16 = true;
                        }
                        auVar55 = vxorps_avx512vl(auVar55,auVar55);
                        auVar75 = ZEXT1664(auVar55);
                        auVar76 = ZEXT3264(local_11f8);
                        auVar77 = ZEXT3264(local_1218);
                        auVar78 = ZEXT3264(local_1238);
                        auVar79 = ZEXT3264(local_1258);
                      }
                    }
                    if (!bVar16) {
                      auVar71 = ZEXT3264(local_1278);
                      auVar73 = ZEXT3264(local_1298);
                      auVar72 = ZEXT3264(local_12b8);
                      auVar74 = ZEXT3264(local_12d8);
                      iVar21 = 0;
                      lVar20 = local_1460;
                      lVar37 = local_1438;
                      lVar24 = local_1440;
                      lVar26 = local_1448;
                      lVar28 = local_1450;
                      lVar30 = local_1458;
                      if (bVar39) {
                        ray->tfar = -INFINITY;
                        iVar21 = 3;
                      }
                      goto LAB_0072541e;
                    }
                  } while (uVar34 != 0);
                }
              }
              uVar17 = uVar17 + 1;
              bVar39 = uVar17 < local_1418;
            } while (uVar17 != local_1418);
            auVar71 = ZEXT3264(local_1278);
            auVar73 = ZEXT3264(local_1298);
            auVar72 = ZEXT3264(local_12b8);
            auVar74 = ZEXT3264(local_12d8);
            iVar21 = 0;
            lVar20 = local_1460;
            lVar37 = local_1438;
            lVar24 = local_1440;
            lVar26 = local_1448;
            lVar28 = local_1450;
            lVar30 = local_1458;
          }
        }
LAB_0072541e:
        unaff_R12 = local_1430;
      } while (iVar21 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }